

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

HRESULT __thiscall
Js::SourceTextModuleRecord::PrepareForModuleDeclarationInitialization(SourceTextModuleRecord *this)

{
  Var pvVar1;
  JavascriptPromise *pJVar2;
  ScriptContext *scriptContext;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  undefined4 *puVar10;
  undefined4 extraout_var_00;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  char16_t *pcVar9;
  
  pvVar1 = (this->normalizedSpecifier).ptr;
  if (pvVar1 == (Var)0x0) {
    pcVar9 = L"module";
  }
  else {
    pJVar8 = VarTo<Js::JavascriptString>(pvVar1);
    iVar6 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar8);
    pcVar9 = (char16_t *)CONCAT44(extraout_var,iVar6);
  }
  iVar6 = 0;
  Output::TraceWithFlush(ModulePhase,L"PrepareForModuleDeclarationInitialization(%s)\n",pcVar9);
  bVar5 = ConfirmChildrenParsed(this);
  if (bVar5) {
    iVar6 = 0;
    Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentsAsNeeded\n");
    NotifyParentsAsNeeded(this);
    if ((this->wasDeclarationInitialized == false) &&
       (pJVar2 = (this->promise).ptr, (pJVar2 != (JavascriptPromise *)0x0 | this->isRootModule) == 1
       )) {
      scriptContext = (this->scriptContext).ptr;
      if ((pJVar2 == (JavascriptPromise *)0x0 & scriptContext->threadContext->isScriptActive) == 1)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x179,
                                    "(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr)"
                                    ,
                                    "!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr"
                                   );
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      iVar7 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])(this);
      if ((char)iVar7 != '\0') {
        (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0xb])(this);
      }
      if ((this->errorObject).ptr != (void *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
      }
      if ((this->hadNotifyHostReady == false) &&
         ((this->super_ModuleRecordBase).wasEvaluated == false)) {
        pvVar1 = (this->normalizedSpecifier).ptr;
        if (pvVar1 == (Var)0x0) {
          pcVar9 = L"module";
        }
        else {
          pJVar8 = VarTo<Js::JavascriptString>(pvVar1);
          iVar6 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar8);
          pcVar9 = (char16_t *)CONCAT44(extraout_var_00,iVar6);
        }
        Output::TraceWithFlush
                  (ModulePhase,
                   L"\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"
                   ,pcVar9);
        if (scriptContext->threadContext->isScriptActive == true) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,
                     &stack0xfffffffffffffff8);
          pTVar3 = scriptContext->threadContext;
          bVar5 = pTVar3->reentrancySafeOrHandled;
          pTVar3->reentrancySafeOrHandled = true;
          iVar6 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
          pTVar3->reentrancySafeOrHandled = bVar5;
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58);
        }
        else {
          local_58._0_4_ = ExceptionCheck::Save();
          iVar6 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ExceptionCheck::Restore((Data *)local_58);
        }
        this->hadNotifyHostReady = true;
      }
    }
  }
  return iVar6;
}

Assistant:

HRESULT SourceTextModuleRecord::PrepareForModuleDeclarationInitialization()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("PrepareForModuleDeclarationInitialization(%s)\n"), this->GetSpecifierSz());
        HRESULT hr = NO_ERROR;

        if (ConfirmChildrenParsed())
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentsAsNeeded\n"));
            NotifyParentsAsNeeded();

            if (!WasDeclarationInitialized() && (isRootModule || promise != nullptr))
            {
                // TODO: move this as a promise call? if parser is called from a different thread
                // We'll need to call the bytecode gen in the main thread as we are accessing GC.
                ScriptContext* scriptContext = GetScriptContext();
                Assert(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr);

                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                }

                if (!hadNotifyHostReady && !WasEvaluated())
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"), this->GetSpecifierSz());
                    LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                    {
                        hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                    });

                    hadNotifyHostReady = true;
                }
            }
        }
        return hr;
    }